

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.h
# Opt level: O0

void __thiscall
dlib::sgd::update_considering_bias<dlib::con_<512l,3l,3l,2,2,0,0>>
          (sgd *this,float learning_rate,con_<512L,_3L,_3L,_2,_2,_0,_0> *l,tensor *params_grad,
          unsigned_long bias_offset)

{
  size_t sVar1;
  ostream *poVar2;
  undefined8 uVar3;
  undefined8 in_RCX;
  con_<512L,_3L,_3L,_2,_2,_0,_0> *in_RSI;
  tensor *in_RDI;
  float in_XMM0_Da;
  tensor *src3;
  con_<512L,_3L,_3L,_2,_2,_0,_0> *obj;
  double dVar4;
  double wd;
  double lr;
  ostringstream dlib_o_out;
  tensor *params;
  float in_stack_fffffffffffffd8c;
  resizable_tensor *in_stack_fffffffffffffd90;
  con_<512L,_3L,_3L,_2,_2,_0,_0> *in_stack_fffffffffffffda0;
  tensor *in_stack_fffffffffffffda8;
  resizable_tensor *in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdb8;
  size_t in_stack_fffffffffffffdc0;
  ostringstream local_1a8 [376];
  tensor *local_30;
  undefined8 local_28;
  con_<512L,_3L,_3L,_2,_2,_0,_0> *local_18;
  float local_c;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  local_30 = con_<512L,_3L,_3L,_2,_2,_0,_0>::get_layer_params(in_RSI);
  sVar1 = tensor::size(local_30);
  if (sVar1 == 0) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x9f);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_1a8,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/dnn/solvers.h"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_1a8,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::sgd::update_considering_bias(const float, const layer_type &, const tensor &, unsigned long) [layer_type = dlib::con_<512, 3, 3, 2, 2>]"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)local_1a8,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"params.size() != 0");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(local_1a8,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\n");
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)poVar2,(error_type)((ulong)uVar3 >> 0x20),
               (string *)in_stack_fffffffffffffda0);
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  sVar1 = tensor::size(in_RDI);
  if (sVar1 == 0) {
    resizable_tensor::copy_size(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    resizable_tensor::operator=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c);
  }
  src3 = (tensor *)(double)local_c;
  get_learning_rate_multiplier<dlib::con_<512l,3l,3l,2,2,0,0>>(in_stack_fffffffffffffda0);
  obj = (con_<512L,_3L,_3L,_2,_2,_0,_0> *)(double)*(float *)&in_RDI[3].m_n;
  get_weight_decay_multiplier<dlib::con_<512l,3l,3l,2,2,0,0>>(obj);
  dVar4 = con_<512L,_3L,_3L,_2,_2,_0,_0>::get_bias_learning_rate_multiplier(local_18);
  if ((dVar4 == 1.0) && (!NAN(dVar4))) {
    dVar4 = con_<512L,_3L,_3L,_2,_2,_0,_0>::get_bias_weight_decay_multiplier(local_18);
    if ((dVar4 == 1.0) && (!NAN(dVar4))) {
      tt::affine_transform
                (&in_stack_fffffffffffffdb0->super_tensor,in_stack_fffffffffffffda8,(tensor *)obj,
                 src3,(float)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                 SUB84(in_stack_fffffffffffffd90,0),in_stack_fffffffffffffd8c);
      return;
    }
  }
  tt::affine_transform_range
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             &in_stack_fffffffffffffdb0->super_tensor,in_stack_fffffffffffffda8,(tensor *)obj,src3,
             (float)((ulong)in_stack_fffffffffffffd90 >> 0x20),SUB84(in_stack_fffffffffffffd90,0),
             in_stack_fffffffffffffd8c);
  con_<512L,_3L,_3L,_2,_2,_0,_0>::get_bias_learning_rate_multiplier(local_18);
  con_<512L,_3L,_3L,_2,_2,_0,_0>::get_bias_weight_decay_multiplier(local_18);
  tensor::size(in_RDI);
  tt::affine_transform_range
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             &in_stack_fffffffffffffdb0->super_tensor,in_stack_fffffffffffffda8,(tensor *)obj,src3,
             (float)((ulong)local_28 >> 0x20),(float)local_28,in_stack_fffffffffffffd8c);
  return;
}

Assistant:

void update_considering_bias(
            const float learning_rate,
            const layer_type& l,
            const tensor& params_grad,
            unsigned long bias_offset
        )
        {
            const tensor& params = l.get_layer_params();

            DLIB_CASSERT(params.size() != 0);
            if (v.size() == 0)
            {
                v.copy_size(params_grad);
                v = 0;
            }

            double lr = learning_rate*get_learning_rate_multiplier(l);
            double wd = weight_decay*get_weight_decay_multiplier(l);
            
            //perform: v = momentum*mat(v) - wd*lr*mat(params) - lr*mat(params_grad);

            if (l.get_bias_learning_rate_multiplier() == 1 && l.get_bias_weight_decay_multiplier() == 1)
            {
                tt::affine_transform(v, v, params, params_grad, momentum, -wd*lr, -lr);
            }
            else
            {

                tt::affine_transform_range(0, bias_offset, v, v, params, params_grad, momentum, -wd*lr, -lr);

                // now update the biases but apply their multipliers
                lr *= l.get_bias_learning_rate_multiplier();
                wd *= l.get_bias_weight_decay_multiplier();
                tt::affine_transform_range(bias_offset, v.size(), v, v, params, params_grad, momentum, -wd*lr, -lr);
            }
        }